

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O1

ValueType * __thiscall
nanovdb::
InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
::
getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
          (InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
           *this,CoordType *ijk,
          ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
          *acc)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ValueType *pVVar4;
  
  uVar2 = ((uint)ijk->mVec[1] >> 2 & 0x3e0) + (ijk->mVec[0] & 0xf80U) * 8;
  uVar3 = (ulong)((uint)ijk->mVec[2] >> 7 & 0x1f | uVar2);
  if ((*(ulong *)(this + (ulong)(uVar2 >> 6) * 8 + 0x1000) >> (uVar3 & 0x3f) & 1) != 0) {
    iVar1 = *(int *)(this + 0x22020);
    uVar2 = *(uint *)(this + uVar3 * 4 + 0x2000);
    (acc->mKey).mVec[2] = ijk->mVec[2];
    *(undefined8 *)(acc->mKey).mVec = *(undefined8 *)ijk->mVec;
    acc->mNode[1] =
         (InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *)
         (this + (ulong)uVar2 * 0x4440 + (long)iVar1 * 0x22040);
    pVVar4 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
             getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                       ((InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *
                        )(this + (ulong)uVar2 * 0x4440 + (long)iVar1 * 0x22040),ijk,acc);
    return pVVar4;
  }
  return (ValueType *)(this + uVar3 * 4 + 0x2000);
}

Assistant:

__hostdev__ const ValueType& getValueAndCache(const CoordType& ijk, const AccT& acc) const
    {
        const uint32_t n = CoordToOffset(ijk);
        if (!DataType::mChildMask.isOn(n))
            return DataType::mTable[n].value;
        const ChildT* child = this->child(n);
        acc.insert(ijk, child);
        return child->getValueAndCache(ijk, acc);
    }